

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_insertAndFindFirstIndex_internal
              (ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,U32 mls)

{
  U32 hBits;
  uint uVar1;
  U32 *pUVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  uint uVar5;
  size_t sVar6;
  size_t h;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 chainMask;
  U32 *chainTable;
  U32 hashLog;
  U32 *hashTable;
  U32 mls_local;
  BYTE *ip_local;
  ZSTD_compressionParameters *cParams_local;
  ZSTD_matchState_t *ms_local;
  
  pUVar2 = ms->hashTable;
  hBits = cParams->hashLog;
  pUVar3 = ms->chainTable;
  uVar1 = cParams->chainLog;
  pBVar4 = (ms->window).base;
  uVar5 = (int)ip - (int)pBVar4;
  for (h._0_4_ = ms->nextToUpdate; (U32)h < uVar5; h._0_4_ = (U32)h + 1) {
    sVar6 = ZSTD_hashPtr(pBVar4 + (U32)h,hBits,mls);
    pUVar3[(U32)h & (1 << ((byte)uVar1 & 0x1f)) - 1U] = pUVar2[sVar6];
    pUVar2[sVar6] = (U32)h;
  }
  ms->nextToUpdate = uVar5;
  sVar6 = ZSTD_hashPtr(ip,hBits,mls);
  return pUVar2[sVar6];
}

Assistant:

static U32 ZSTD_insertAndFindFirstIndex_internal(
                        ZSTD_matchState_t* ms,
                        const ZSTD_compressionParameters* const cParams,
                        const BYTE* ip, U32 const mls)
{
    U32* const hashTable  = ms->hashTable;
    const U32 hashLog = cParams->hashLog;
    U32* const chainTable = ms->chainTable;
    const U32 chainMask = (1 << cParams->chainLog) - 1;
    const BYTE* const base = ms->window.base;
    const U32 target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    while(idx < target) { /* catch up */
        size_t const h = ZSTD_hashPtr(base+idx, hashLog, mls);
        NEXT_IN_CHAIN(idx, chainMask) = hashTable[h];
        hashTable[h] = idx;
        idx++;
    }

    ms->nextToUpdate = target;
    return hashTable[ZSTD_hashPtr(ip, hashLog, mls)];
}